

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.h
# Opt level: O2

bool simplejson_wcsnlen(wchar_t *s,size_t n)

{
  wchar_t *pwVar1;
  size_t sVar2;
  bool bVar3;
  
  if (s == (wchar_t *)0x0) {
    return false;
  }
  sVar2 = 0;
  do {
    bVar3 = n == sVar2;
    if (bVar3) {
      return bVar3;
    }
    pwVar1 = s + sVar2;
    sVar2 = sVar2 + 1;
  } while (*pwVar1 != L'\0');
  return bVar3;
}

Assistant:

static inline bool simplejson_wcsnlen(const wchar_t *s, size_t n) {
	if (s == 0)
		return false;

	const wchar_t *save = s;
	while (n-- > 0)
	{
		if (*(save++) == 0) return false;
	}

	return true;
}